

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,int n)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCtab *t_00;
  TValue *local_80;
  TValue *src;
  TValue *dst;
  GCtab *t;
  int n_local;
  int idx_local;
  lua_State *L_local;
  GCobj *o;
  
  pTVar2 = index2adr(L,idx);
  t_00 = (GCtab *)(pTVar2->u64 & 0x7fffffffffff);
  if ((uint)n < t_00->asize) {
    local_80 = (TValue *)((t_00->array).ptr64 + (long)n * 8);
  }
  else {
    local_80 = lj_tab_setinth(L,t_00,n);
  }
  pTVar2 = L->top;
  *local_80 = pTVar2[-1];
  if (((0xfffffff6 < ((int)(local_80->field_4).it >> 0xf) + 4U) &&
      ((*(byte *)((local_80->u64 & 0x7fffffffffff) + 8) & 3) != 0)) && ((t_00->marked & 4) != 0)) {
    uVar1 = (L->glref).ptr64;
    t_00->marked = t_00->marked & 0xfb;
    (t_00->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t_00;
  }
  L->top = pTVar2 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  lj_checkapi_slot(1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}